

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_overlay(Integer g_a,Integer g_parent)

{
  short sVar1;
  short sVar2;
  C_Integer *pCVar3;
  C_Integer CVar4;
  Integer IVar5;
  logical lVar6;
  long in_RSI;
  long in_RDI;
  bool bVar7;
  Integer me_local;
  Integer _ndim_7;
  Integer _i_7;
  Integer _itmp_4;
  Integer offset;
  Integer index_2 [7];
  Integer imax_2;
  Integer imin_2;
  Integer skip_2;
  Integer jtot_2;
  Integer j_3;
  Integer _ndim_6;
  Integer _i_6;
  Integer _itmp_3;
  Integer index_1 [7];
  Integer imax_1;
  Integer imin_1;
  Integer skip_1;
  Integer jtot_1;
  Integer j_2;
  Integer _ndim_5;
  Integer _i_5;
  Integer _itmp_2;
  Integer index [7];
  Integer imax;
  Integer imin;
  Integer skip;
  Integer jtot;
  Integer j_1;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer lo [7];
  Integer j;
  Integer tsize;
  Integer nblocks;
  Integer b;
  Integer ddim;
  int p;
  Integer pcut;
  Integer nblock;
  Integer block_size;
  Integer grp_nproc;
  Integer grp_me;
  Integer blk [7];
  Integer *map;
  Integer *pmap [7];
  Integer pe [7];
  Integer chunk [7];
  Integer dims [7];
  Integer p_handle;
  Integer maplen;
  Integer status;
  Integer i;
  Integer nelem;
  Integer mem_size;
  Integer ndim;
  Integer width [7];
  Integer d;
  Integer g_p;
  Integer ga_handle;
  Integer hi [7];
  long in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  void *in_stack_fffffffffffffad8;
  long in_stack_fffffffffffffae0;
  long local_518;
  long local_500;
  Integer local_4f8;
  long local_4f0;
  long local_4e8 [3];
  Integer *in_stack_fffffffffffffb30;
  Integer *in_stack_fffffffffffffb38;
  Integer in_stack_fffffffffffffb40;
  double in_stack_fffffffffffffb48;
  Integer in_stack_fffffffffffffb50;
  Integer *in_stack_fffffffffffffb58;
  Integer in_stack_fffffffffffffb60;
  long local_490;
  long local_488;
  long local_478;
  Integer local_470;
  long local_468 [8];
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  Integer local_3f0;
  long local_3e8 [8];
  C_Integer in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  long local_390;
  long local_388;
  int local_37c;
  int local_378;
  int local_374;
  int local_36c;
  int local_368 [7];
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  int local_338 [10];
  int local_310;
  int local_30c;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  C_Integer aCStack_298 [7];
  long local_260;
  long local_258;
  C_Integer local_250;
  long local_248;
  long local_240;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  Integer *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  long g_a_00;
  Integer local_218;
  long local_208 [7];
  Integer *local_1d0;
  undefined8 auStack_1c8 [8];
  long local_188 [8];
  long local_148 [8];
  C_Integer local_108 [7];
  long local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  C_Long local_a8;
  long local_a0;
  C_Integer aCStack_98 [7];
  long local_60;
  long local_58;
  long local_50;
  C_Integer local_48 [9];
  
  local_50 = in_RDI + 1000;
  local_58 = in_RSI + 1000;
  local_c8 = 0;
  local_218 = GAnproc;
  g_a_00 = 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (GA[local_50].ndim == -1) {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  local_d0 = (long)GA[local_50].p_handle;
  if (local_d0 == GA_Init_Proc_Group) {
    GA[local_50].p_handle = GA_Default_Proc_Group;
    local_d0 = (long)GA_Default_Proc_Group;
  }
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffac0);
  if (local_d0 != GA[local_58].p_handle) {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  if (0 < local_d0) {
    local_218 = (Integer)PGRP_LIST[local_d0].map_nproc;
  }
  if (GAinitialized == 0) {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  if (ma_address_init == 0) {
    gai_ma_address_init();
  }
  sVar1 = GA[local_50].ndim;
  local_a0 = (long)sVar1;
  for (local_b8 = 0; local_b8 < sVar1; local_b8 = local_b8 + 1) {
    aCStack_98[local_b8] = GA[local_50].width[local_b8];
  }
  if ((GA[local_50].mapc == (C_Integer *)0x0) && (GA[local_50].distr_type == 0)) {
    for (local_60 = 0; local_60 < local_a0; local_60 = local_60 + 1) {
      local_108[local_60] = GA[local_50].dims[local_60];
      local_148[local_60] = GA[local_50].chunk[local_60];
    }
    if (local_148[0] == 0) {
      for (local_60 = 0; local_60 < local_a0; local_60 = local_60 + 1) {
        local_208[local_60] = -1;
      }
    }
    else {
      for (local_60 = 0; local_60 < local_a0; local_60 = local_60 + 1) {
        if (local_108[local_60] < local_148[local_60]) {
          local_518 = local_108[local_60];
        }
        else {
          local_518 = local_148[local_60];
        }
        local_208[local_60] = local_518;
      }
    }
    for (local_60 = 0; local_60 < local_a0; local_60 = local_60 + 1) {
      if (local_108[local_60] == 1) {
        local_208[local_60] = 1;
      }
    }
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffac0);
    if (local_d0 == 0) {
      ddb_h2(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
    }
    else if (GA[local_50].num_rstrctd == 0) {
      ddb_h2(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
    }
    else {
      ddb_h2(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
    }
    local_1d0 = mapALL;
    for (local_60 = 0; local_60 < local_a0; local_60 = local_60 + 1) {
      auStack_1c8[local_60] = local_1d0;
      if (local_148[local_60] < 2) {
        in_stack_fffffffffffffdd0 =
             (Integer *)(local_108[local_60] - (local_208[local_60] + -1) * local_188[local_60]);
      }
      else {
        in_stack_fffffffffffffae0 = local_108[local_60] + -1;
        if (local_108[local_60] < local_148[local_60]) {
          in_stack_fffffffffffffad8 = (void *)local_108[local_60];
        }
        else {
          in_stack_fffffffffffffad8 = (void *)local_148[local_60];
        }
        local_240 = in_stack_fffffffffffffae0 / (long)in_stack_fffffffffffffad8 + 1;
        in_stack_fffffffffffffdd0 =
             (Integer *)(local_240 - (local_208[local_60] + -1) * local_188[local_60]);
      }
      in_stack_fffffffffffffdcc = 0;
      local_b8 = 0;
      in_stack_fffffffffffffdd8 = (char *)0x0;
      while( true ) {
        bVar7 = false;
        if ((long)in_stack_fffffffffffffdcc < local_188[local_60]) {
          bVar7 = local_b8 < local_108[local_60];
        }
        if (!bVar7) break;
        local_248 = local_208[local_60];
        if ((long)in_stack_fffffffffffffdd0 <= (long)in_stack_fffffffffffffdcc) {
          local_248 = local_208[local_60] + -1;
        }
        local_1d0[(long)in_stack_fffffffffffffdd8] = local_b8 + 1;
        if (1 < local_148[local_60]) {
          if (local_108[local_60] < local_148[local_60]) {
            in_stack_fffffffffffffac8 = (char *)local_108[local_60];
          }
          else {
            in_stack_fffffffffffffac8 = (char *)local_148[local_60];
          }
          local_248 = (long)in_stack_fffffffffffffac8 * local_248;
        }
        local_b8 = local_248 + local_b8;
        in_stack_fffffffffffffdcc = in_stack_fffffffffffffdcc + 1;
        in_stack_fffffffffffffdd8 = in_stack_fffffffffffffdd8 + 1;
      }
      in_stack_fffffffffffffac0 = in_stack_fffffffffffffdd8;
      if (local_188[local_60] <= (long)in_stack_fffffffffffffdd8) {
        in_stack_fffffffffffffac0 = (char *)local_188[local_60];
      }
      local_188[local_60] = (long)in_stack_fffffffffffffac0;
      local_1d0 = local_1d0 + local_188[local_60];
      in_stack_fffffffffffffad7 = 0;
    }
    local_c8 = 0;
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      GA[local_50].nblock[local_b8] = (int)local_188[local_b8];
      local_c8 = local_188[local_b8] + local_c8;
    }
    pCVar3 = (C_Integer *)malloc((local_c8 + 1) * 8);
    GA[local_50].mapc = pCVar3;
    for (local_b8 = 0; local_b8 < local_c8; local_b8 = local_b8 + 1) {
      GA[local_50].mapc[local_b8] = mapALL[local_b8];
    }
    GA[local_50].mapc[local_c8] = -1;
  }
  else if (GA[local_50].distr_type == 1) {
    local_250 = GA[local_50].block_total;
    g_a_00 = 0;
    for (local_b8 = GAme; local_b8 < local_250; local_b8 = GAnproc + local_b8) {
      if (GA[local_50].distr_type == 0) {
        if (GA[local_50].num_rstrctd == 0) {
          local_2c0 = (long)GA[local_50].ndim;
          local_2c8 = 0;
          local_2a8 = 1;
          for (local_2b0 = 0; local_2b0 < local_2c0; local_2b0 = local_2b0 + 1) {
            local_2a8 = GA[local_50].nblock[local_2b0] * local_2a8;
          }
          if ((local_2a8 + -1 < local_b8) || (local_b8 < 0)) {
            for (local_2b0 = 0; local_2b0 < local_2c0; local_2b0 = local_2b0 + 1) {
              aCStack_298[local_2b0] = 0;
              local_48[local_2b0] = -1;
            }
          }
          else {
            local_2b8 = local_b8;
            for (local_2b0 = 0; local_2b0 < local_2c0; local_2b0 = local_2b0 + 1) {
              local_2a0 = local_2b8 % (long)GA[local_50].nblock[local_2b0];
              local_2b8 = local_2b8 / (long)GA[local_50].nblock[local_2b0];
              local_2d0 = local_2a0 + local_2c8;
              local_2c8 = GA[local_50].nblock[local_2b0] + local_2c8;
              aCStack_298[local_2b0] = GA[local_50].mapc[local_2d0];
              if (local_2a0 == GA[local_50].nblock[local_2b0] + -1) {
                local_48[local_2b0] = GA[local_50].dims[local_2b0];
              }
              else {
                local_48[local_2b0] = GA[local_50].mapc[local_2d0 + 1] + -1;
              }
            }
          }
        }
        else if (local_b8 < GA[local_50].num_rstrctd) {
          local_2f8 = (long)GA[local_50].ndim;
          local_300 = 0;
          local_2e0 = 1;
          for (local_2e8 = 0; local_2e8 < local_2f8; local_2e8 = local_2e8 + 1) {
            local_2e0 = GA[local_50].nblock[local_2e8] * local_2e0;
          }
          if ((local_2e0 + -1 < local_b8) || (local_b8 < 0)) {
            for (local_2e8 = 0; local_2e8 < local_2f8; local_2e8 = local_2e8 + 1) {
              aCStack_298[local_2e8] = 0;
              local_48[local_2e8] = -1;
            }
          }
          else {
            local_2f0 = local_b8;
            for (local_2e8 = 0; local_2e8 < local_2f8; local_2e8 = local_2e8 + 1) {
              local_2d8 = local_2f0 % (long)GA[local_50].nblock[local_2e8];
              local_2f0 = local_2f0 / (long)GA[local_50].nblock[local_2e8];
              local_308 = local_2d8 + local_300;
              local_300 = GA[local_50].nblock[local_2e8] + local_300;
              aCStack_298[local_2e8] = GA[local_50].mapc[local_308];
              if (local_2d8 == GA[local_50].nblock[local_2e8] + -1) {
                local_48[local_2e8] = GA[local_50].dims[local_2e8];
              }
              else {
                local_48[local_2e8] = GA[local_50].mapc[local_308 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_50].ndim;
          local_310 = (int)sVar1;
          for (local_30c = 0; local_30c < sVar1; local_30c = local_30c + 1) {
            aCStack_298[local_30c] = 0;
            local_48[local_30c] = -1;
          }
        }
      }
      else {
        local_378 = (int)local_b8;
        if (((GA[local_50].distr_type == 1) || (GA[local_50].distr_type == 2)) ||
           (GA[local_50].distr_type == 3)) {
          sVar1 = GA[local_50].ndim;
          local_340 = (int)sVar1;
          sVar2 = GA[local_50].ndim;
          local_34c = (int)sVar2;
          local_344 = local_378;
          local_338[0] = (int)((long)local_378 % GA[local_50].num_blocks[0]);
          for (local_348 = 1; local_348 < sVar2; local_348 = local_348 + 1) {
            local_344 = (int)((long)(local_344 - local_338[local_348 + -1]) /
                             GA[local_50].num_blocks[local_348 + -1]);
            local_338[local_348] = (int)((long)local_344 % GA[local_50].num_blocks[local_348]);
          }
          for (local_33c = 0; local_33c < sVar1; local_33c = local_33c + 1) {
            aCStack_298[local_33c] =
                 (long)local_338[local_33c] * GA[local_50].block_dims[local_33c] + 1;
            local_48[local_33c] =
                 (long)(local_338[local_33c] + 1) * GA[local_50].block_dims[local_33c];
            if (GA[local_50].dims[local_33c] < local_48[local_33c]) {
              local_48[local_33c] = GA[local_50].dims[local_33c];
            }
          }
        }
        else if (GA[local_50].distr_type == 4) {
          sVar1 = GA[local_50].ndim;
          local_374 = 0;
          sVar2 = GA[local_50].ndim;
          local_368[0] = (int)((long)local_378 % GA[local_50].num_blocks[0]);
          for (local_37c = 1; local_37c < sVar2; local_37c = local_37c + 1) {
            local_378 = (int)((long)(local_378 - local_368[local_37c + -1]) /
                             GA[local_50].num_blocks[local_37c + -1]);
            local_368[local_37c] = (int)((long)local_378 % GA[local_50].num_blocks[local_37c]);
          }
          for (local_36c = 0; local_36c < sVar1; local_36c = local_36c + 1) {
            aCStack_298[local_36c] = GA[local_50].mapc[local_374 + local_368[local_36c]];
            if ((long)local_368[local_36c] < GA[local_50].num_blocks[local_36c] + -1) {
              local_48[local_36c] = GA[local_50].mapc[local_374 + local_368[local_36c] + 1] + -1;
            }
            else {
              local_48[local_36c] = GA[local_50].dims[local_36c];
            }
            local_374 = local_374 + (int)GA[local_50].num_blocks[local_36c];
          }
        }
      }
      local_258 = 1;
      for (local_260 = 0; local_260 < local_a0; local_260 = local_260 + 1) {
        local_258 = ((local_48[local_260] - aCStack_298[local_260]) + 1) * local_258;
      }
      g_a_00 = local_258 + g_a_00;
    }
  }
  else if (GA[local_50].distr_type == 2) {
    sVar1 = GA[local_50].ndim;
    local_400 = (long)sVar1;
    local_3f0 = GAme;
    local_3e8[0] = GAme % (long)GA[local_50].nblock[0];
    for (local_3f8 = 1; local_3f8 < sVar1; local_3f8 = local_3f8 + 1) {
      local_3f0 = (local_3f0 - local_3e8[local_3f8 + -1]) /
                  (long)GA[local_50].nblock[local_3f8 + -1];
      local_3e8[local_3f8] = local_3f0 % (long)GA[local_50].nblock[local_3f8];
    }
    g_a_00 = 1;
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      local_390 = 0;
      for (local_388 = local_3e8[local_b8]; local_388 < GA[local_50].num_blocks[local_b8];
          local_388 = GA[local_50].nblock[local_b8] + local_388) {
        in_stack_fffffffffffffc60 = (char *)(local_388 * GA[local_50].block_dims[local_b8] + 1);
        in_stack_fffffffffffffc58 = (local_388 + 1) * GA[local_50].block_dims[local_b8];
        if (GA[local_50].dims[local_b8] < in_stack_fffffffffffffc58) {
          in_stack_fffffffffffffc58 = GA[local_50].dims[local_b8];
        }
        local_390 = (in_stack_fffffffffffffc58 - (long)in_stack_fffffffffffffc60) + 1 + local_390;
      }
      g_a_00 = local_390 * g_a_00;
    }
  }
  else if (GA[local_50].distr_type == 3) {
    sVar1 = GA[local_50].ndim;
    local_470 = GAme;
    local_468[0] = GAme % (long)GA[local_50].nblock[0];
    for (local_478 = 1; local_478 < sVar1; local_478 = local_478 + 1) {
      local_470 = (local_470 - local_468[local_478 + -1]) /
                  (long)GA[local_50].nblock[local_478 + -1];
      local_468[local_478] = local_470 % (long)GA[local_50].nblock[local_478];
    }
    g_a_00 = 1;
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      local_418 = (long)GA[local_50].nblock[local_b8];
      local_410 = 0;
      for (local_408 = local_468[local_b8]; local_408 < GA[local_50].num_blocks[local_b8];
          local_408 = GA[local_50].nblock[local_b8] + local_408) {
        local_420 = local_408 * GA[local_50].block_dims[local_b8] + 1;
        local_428 = (local_408 + 1) * GA[local_50].block_dims[local_b8];
        if (GA[local_50].dims[local_b8] < local_428) {
          local_428 = GA[local_50].dims[local_b8];
        }
        local_410 = (local_428 - local_420) + 1 + local_410;
      }
      g_a_00 = local_410 * g_a_00;
    }
  }
  else if (GA[local_50].distr_type == 4) {
    local_4f0 = 0;
    sVar1 = GA[local_50].ndim;
    local_4f8 = GAme;
    local_4e8[0] = GAme % (long)GA[local_50].nblock[0];
    for (local_500 = 1; local_500 < sVar1; local_500 = local_500 + 1) {
      local_4f8 = (local_4f8 - local_4e8[local_500 + -1]) /
                  (long)GA[local_50].nblock[local_500 + -1];
      local_4e8[local_500] = local_4f8 % (long)GA[local_50].nblock[local_500];
    }
    g_a_00 = 1;
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      local_490 = 0;
      for (local_488 = local_4e8[local_b8]; local_488 < GA[local_50].num_blocks[local_b8];
          local_488 = GA[local_50].nblock[local_b8] + local_488) {
        if (local_488 < GA[local_50].num_blocks[local_b8] + -1) {
          CVar4 = GA[local_50].mapc[local_4f0 + local_488 + 1] + -1;
        }
        else {
          CVar4 = GA[local_50].dims[local_b8];
        }
        local_490 = (CVar4 - GA[local_50].mapc[local_4f0 + local_488]) + 1 + local_490;
      }
      g_a_00 = local_490 * g_a_00;
      local_4f0 = GA[local_50].num_blocks[local_b8] + local_4f0;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  GA[local_50].actv = 1;
  IVar5 = pnga_cluster_nnodes();
  if ((IVar5 == 1) && (GA[local_50].p_handle == 0)) {
    IVar5 = pnga_pgroup_get_world();
    GA[local_50].p_handle = (int)IVar5;
  }
  if (GA[local_50].distr_type == 0) {
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      GA[local_50].scale[local_b8] =
           (double)GA[local_50].nblock[local_b8] / (double)GA[local_50].dims[local_b8];
    }
    pnga_set_ghost_corner_flag((Integer)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    if (local_d0 == 0) {
      pnga_distribution(g_a_00,(Integer)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                        (Integer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    else {
      pnga_distribution(g_a_00,(Integer)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                        (Integer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    if ((GA[local_50].num_rstrctd == 0) || (GA[local_50].has_data == 1)) {
      local_b0 = 1;
      for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
        local_b0 = ((local_48[local_b8] - GA[local_50].lo[local_b8]) + 1 + aCStack_98[local_b8] * 2)
                   * local_b0;
      }
    }
    else {
      local_b0 = 0;
    }
    local_a8 = local_b0 * GA[local_50].elemsize;
  }
  else {
    local_a8 = g_a_00 * GA[local_50].elemsize;
    for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
      GA[local_50].scale[local_b8] =
           (double)GA[local_50].num_blocks[local_b8] / (double)GA[local_50].dims[local_b8];
    }
  }
  GA[local_50].id = -1;
  GA[local_50].size = local_a8;
  local_c0 = (ulong)(int)(uint)(GA[local_50].size <= GA[local_58].size);
  if (local_d0 < 1) {
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),in_stack_fffffffffffffac8
            );
  }
  else {
    in_stack_fffffffffffffab8 = local_d0;
    pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(in_stack_fffffffffffffae0,(Integer)in_stack_fffffffffffffad8,
                    (void *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                    (Integer)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  }
  if (local_c0 != 0) {
    GA[local_50].overlay = 1;
    GA[local_50].id = GA[local_58].id;
    for (local_b8 = 0; local_b8 < local_218; local_b8 = local_b8 + 1) {
      GA[local_50].ptr[local_b8] = GA[local_58].ptr[local_b8];
    }
  }
  if (((GA[local_50].distr_type == 0) && (GA[local_50].ghosts == 1)) &&
     (lVar6 = pnga_set_ghost_info(in_stack_fffffffffffffab8), lVar6 == 0)) {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffac0);
  bVar7 = local_c0 == 0;
  if (bVar7) {
    pnga_destroy((Integer)in_stack_fffffffffffffad8);
  }
  local_c0 = (ulong)!bVar7;
  return local_c0;
}

Assistant:

logical pnga_overlay(Integer g_a, Integer g_parent)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer g_p = g_parent + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);
  if (p_handle != (Integer)GA[g_p].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* check if everybody has enough memory to fit overlay GA */
  status = (GA[ga_handle].size <= GA[g_p].size) ? 1 : 0;
  if (p_handle > 0) {
    pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  } else {
    pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  }

  if (status) {
    GA[ga_handle].overlay = 1;
    GA[ga_handle].id = GA[g_p].id;
    for (i=0; i<grp_nproc; i++) {
      GA[ga_handle].ptr[i] = GA[g_p].ptr[i];
    }
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    status = TRUE;
  } else {
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}